

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::
     compareEqual<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
               (vector<long,_std::allocator<long>_> *lhs,vector<long,_std::allocator<long>_> *rhs)

{
  bool bVar1;
  vector<long,_std::allocator<long>_> *rhs_local;
  vector<long,_std::allocator<long>_> *lhs_local;
  
  bVar1 = std::operator==(lhs,rhs);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }